

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

void wallet::PreventOutdatedOptions(UniValue *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  UniValue *pUVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"feeRate","");
  bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&bStack_68,"Use fee_rate (",&::CURRENCY_ATOM_abi_cxx11_);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&bStack_68,"/vB) instead of feeRate");
    local_48._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar5) {
      local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_48._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_48._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    JSONRPCError(pUVar4,-8,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"changeAddress","");
    bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Use change_address instead of changeAddress","");
      JSONRPCError(pUVar4,-8,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"changePosition","");
      bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Use change_position instead of changePosition","");
        JSONRPCError(pUVar4,-8,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
      }
      else {
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"includeWatching","");
        bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
          local_48._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Use include_watching instead of includeWatching","");
          JSONRPCError(pUVar4,-8,&local_48);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
        }
        else {
          local_48._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"lockUnspents","");
          bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
            local_48._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"Use lock_unspents instead of lockUnspents","");
            JSONRPCError(pUVar4,-8,&local_48);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
          }
          else {
            local_48._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"subtractFeeFromOutputs","");
            bVar2 = ::UniValue::findKey(options,&local_48,(size_t *)&bStack_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != paVar1) {
              operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
              local_48._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_48,
                         "Use subtract_fee_from_outputs instead of subtractFeeFromOutputs","");
              JSONRPCError(pUVar4,-8,&local_48);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
                __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
              }
            }
            else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              return;
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static void PreventOutdatedOptions(const UniValue& options)
{
    if (options.exists("feeRate")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use fee_rate (" + CURRENCY_ATOM + "/vB) instead of feeRate");
    }
    if (options.exists("changeAddress")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_address instead of changeAddress");
    }
    if (options.exists("changePosition")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_position instead of changePosition");
    }
    if (options.exists("includeWatching")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use include_watching instead of includeWatching");
    }
    if (options.exists("lockUnspents")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use lock_unspents instead of lockUnspents");
    }
    if (options.exists("subtractFeeFromOutputs")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use subtract_fee_from_outputs instead of subtractFeeFromOutputs");
    }
}